

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O2

Value * __thiscall
kj::_::Debug::Context::ensureInitialized(Value *__return_storage_ptr__,Context *this)

{
  int iVar1;
  char *pcVar2;
  Array<char> *this_00;
  Array<char> local_78;
  char *local_58;
  size_t sStack_50;
  ArrayDisposer *local_48;
  size_t local_40;
  ArrayDisposer *pAStack_38;
  
  this_00 = &local_78;
  if ((this->value).ptr.isSet == true) {
    pcVar2 = (this->value).ptr.field_1.value.file;
    iVar1 = (this->value).ptr.field_1.value.line;
    this_00 = (Array<char> *)&local_58;
    heapString((String *)this_00,&(this->value).ptr.field_1.value.description);
    __return_storage_ptr__->file = pcVar2;
    __return_storage_ptr__->line = iVar1;
    (__return_storage_ptr__->description).content.ptr = local_58;
    (__return_storage_ptr__->description).content.size_ = sStack_50;
    (__return_storage_ptr__->description).content.disposer = local_48;
    local_58 = (char *)0x0;
    sStack_50 = 0;
  }
  else {
    (*(this->super_ExceptionCallback)._vptr_ExceptionCallback[7])(__return_storage_ptr__,this);
    pcVar2 = __return_storage_ptr__->file;
    iVar1 = __return_storage_ptr__->line;
    heapString((String *)&local_78,&__return_storage_ptr__->description);
    sStack_50 = CONCAT44(sStack_50._4_4_,iVar1);
    local_48 = (ArrayDisposer *)local_78.ptr;
    local_40 = local_78.size_;
    pAStack_38 = local_78.disposer;
    local_78.ptr = (char *)0x0;
    local_78.size_ = 0;
    local_58 = pcVar2;
    NullableValue<kj::_::Debug::Context::Value>::emplace<kj::_::Debug::Context::Value>
              (&(this->value).ptr,(Value *)&local_58);
    Array<char>::~Array((Array<char> *)&local_48);
  }
  Array<char>::~Array(this_00);
  return __return_storage_ptr__;
}

Assistant:

Debug::Context::Value Debug::Context::ensureInitialized() {
  KJ_IF_MAYBE(v, value) {
    return Value(v->file, v->line, heapString(v->description));
  } else {
    Value result = evaluate();
    value = Value(result.file, result.line, heapString(result.description));
    return result;
  }